

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O0

size_t __thiscall
sai::VirtualFileEntry::Read
          (VirtualFileEntry *this,span<std::byte,_18446744073709551615UL> Destination)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  pointer pbVar4;
  pointer pbVar5;
  reference pvVar6;
  size_type sVar7;
  VirtualPage local_1068;
  long local_68;
  size_t BytesWritten;
  size_t Read;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> local_48;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> ReadBuffer;
  shared_ptr<sai::ifstream> Stream;
  size_type sStack_28;
  bool NeedsNextPage;
  size_t LeftToRead;
  VirtualFileEntry *this_local;
  span<std::byte,_18446744073709551615UL> Destination_local;
  
  Destination_local._M_ptr = (pointer)Destination._M_extent._M_extent_value;
  this_local = (VirtualFileEntry *)Destination._M_ptr;
  sStack_28 = std::span<std::byte,_18446744073709551615UL>::size
                        ((span<std::byte,_18446744073709551615UL> *)&this_local);
  bVar1 = false;
  std::weak_ptr<sai::ifstream>::lock((weak_ptr<sai::ifstream> *)&ReadBuffer);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ReadBuffer);
  if (bVar2) {
    std::make_unique<std::byte[]>((size_t)&local_48);
    do {
      while( true ) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ReadBuffer);
        if (!bVar2) goto LAB_0010d3cc;
        peVar3 = std::__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ReadBuffer);
        std::istream::seekg((long)peVar3,(int)(this->PageIndex << 0xc) + (int)this->PageOffset);
        if (sStack_28 + this->PageOffset < 0x1000) {
          BytesWritten = sStack_28;
          this->PageOffset = sStack_28 + this->PageOffset;
        }
        else {
          BytesWritten = 0x1000 - this->PageOffset;
          this->PageOffset = 0;
          bVar1 = true;
        }
        peVar3 = std::__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<sai::ifstream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ReadBuffer);
        pbVar4 = std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::get(&local_48);
        std::istream::read((char *)peVar3,(long)pbVar4);
        sVar7 = std::span<std::byte,_18446744073709551615UL>::size
                          ((span<std::byte,_18446744073709551615UL> *)&this_local);
        local_68 = sVar7 - sStack_28;
        pbVar5 = std::span<std::byte,_18446744073709551615UL>::data
                           ((span<std::byte,_18446744073709551615UL> *)&this_local);
        pbVar5 = pbVar5 + local_68;
        pbVar4 = std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::get(&local_48);
        memcpy(pbVar5,pbVar4,BytesWritten);
        this->Offset = BytesWritten + this->Offset;
        sStack_28 = sStack_28 - BytesWritten;
        if (!bVar1) break;
        GetTablePage(&local_1068,this,this->PageIndex);
        pvVar6 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                           (&local_1068.PageEntries,this->PageIndex & 0x1ff);
        this->PageIndex = (ulong)pvVar6->NextPageIndex;
        bVar1 = false;
      }
    } while (sStack_28 != 0);
LAB_0010d3cc:
    std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::~unique_ptr(&local_48);
  }
  std::shared_ptr<sai::ifstream>::~shared_ptr((shared_ptr<sai::ifstream> *)&ReadBuffer);
  sVar7 = std::span<std::byte,_18446744073709551615UL>::size
                    ((span<std::byte,_18446744073709551615UL> *)&this_local);
  return sVar7 - sStack_28;
}

Assistant:

std::size_t VirtualFileEntry::Read(std::span<std::byte> Destination)
{
	std::size_t LeftToRead    = Destination.size();
	bool        NeedsNextPage = false;

	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		std::unique_ptr<std::byte[]> ReadBuffer
			= std::make_unique<std::byte[]>(VirtualPage::PageSize);

		while( Stream )
		{
			Stream->seekg(PageIndex * VirtualPage::PageSize + PageOffset, std::ios::beg);

			std::size_t Read;
			if( LeftToRead + PageOffset >= VirtualPage::PageSize )
			{
				Read          = VirtualPage::PageSize - PageOffset;
				PageOffset    = 0;
				NeedsNextPage = true;
			}
			else
			{
				Read = LeftToRead;
				PageOffset += Read;
			}

			Stream->read(reinterpret_cast<char*>(ReadBuffer.get()), Read);
			const std::size_t BytesWritten = Destination.size() - LeftToRead;
			std::memcpy(Destination.data() + BytesWritten, ReadBuffer.get(), Read);

			Offset += Read;
			LeftToRead -= Read;

			if( NeedsNextPage )
			{
				// NOTE: The reason this is here, instead of moving it into the
				// `if (LeftToRead...)` is because `GetTablePage` seeks the
				// stream which mess-ups its position.
				PageIndex = GetTablePage(PageIndex)
								.PageEntries[PageIndex % VirtualPage::TableSpan]
								.NextPageIndex;
				NeedsNextPage = false;
			}
			else if( LeftToRead == 0 )
				break;
		}
	}

	return Destination.size() - LeftToRead;
}